

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advertise_options.h
# Opt level: O0

void __thiscall
miniros::AdvertiseOptions::init<rosgraph_msgs::Log_<std::allocator<void>>>
          (AdvertiseOptions *this,string *_topic,uint32_t _queue_size,
          SubscriberStatusCallback *_connect_cb,SubscriberStatusCallback *_disconnect_cb)

{
  string sVar1;
  char *pcVar2;
  undefined4 in_EDX;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_RSI;
  string *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::operator=(in_RDI,(string *)in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = in_EDX;
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::operator=
            (in_RSI,(function<void_(const_miniros::SingleSubscriberPublisher_&)> *)
                    CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::operator=
            (in_RSI,(function<void_(const_miniros::SingleSubscriberPublisher_&)> *)
                    CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  pcVar2 = message_traits::md5sum<rosgraph_msgs::Log_<std::allocator<void>>>();
  std::__cxx11::string::operator=(in_RDI + 0x28,pcVar2);
  pcVar2 = message_traits::datatype<rosgraph_msgs::Log_<std::allocator<void>>>();
  std::__cxx11::string::operator=(in_RDI + 0x48,pcVar2);
  pcVar2 = message_traits::definition<rosgraph_msgs::Log_<std::allocator<void>>>();
  std::__cxx11::string::operator=(in_RDI + 0x68,pcVar2);
  sVar1 = (string)message_traits::hasHeader<rosgraph_msgs::Log_<std::allocator<void>>>();
  in_RDI[0xe1] = sVar1;
  return;
}

Assistant:

void init(const std::string& _topic, uint32_t _queue_size,
            const SubscriberStatusCallback& _connect_cb = SubscriberStatusCallback(),
            const SubscriberStatusCallback& _disconnect_cb = SubscriberStatusCallback())
  {
    topic = _topic;
    queue_size = _queue_size;
    connect_cb = _connect_cb;
    disconnect_cb = _disconnect_cb;
    md5sum = message_traits::md5sum<M>();
    datatype = message_traits::datatype<M>();
    message_definition = message_traits::definition<M>();
    has_header = message_traits::hasHeader<M>();
  }